

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licm_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::LICMPass::IsImmediatelyContainedInLoop
          (LICMPass *this,Loop *loop,Function *f,BasicBlock *bb)

{
  Instruction *this_00;
  ulong uVar1;
  uint32_t uVar2;
  LoopDescriptor *pLVar3;
  _Hash_node_base *p_Var4;
  Loop *pLVar5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  
  pLVar3 = IRContext::GetLoopDescriptor((this->super_Pass).context_,f);
  this_00 = (bb->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar2 = 0;
  if (this_00->has_result_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
  }
  uVar1 = (pLVar3->basic_block_to_loop_)._M_h._M_bucket_count;
  uVar6 = (ulong)uVar2 % uVar1;
  p_Var7 = (pLVar3->basic_block_to_loop_)._M_h._M_buckets[uVar6];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var4 = p_Var7->_M_nxt, p_Var8 = p_Var7, *(uint *)&p_Var7->_M_nxt[1]._M_nxt != uVar2)) {
    while (p_Var7 = p_Var4, p_Var4 = p_Var7->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar1 != uVar6) ||
         (p_Var8 = p_Var7, *(uint *)&p_Var4[1]._M_nxt == uVar2)) goto LAB_005dddb9;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_005dddb9:
  if (p_Var8 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var8->_M_nxt;
  }
  if (p_Var4 == (_Hash_node_base *)0x0) {
    pLVar5 = (Loop *)0x0;
  }
  else {
    pLVar5 = (Loop *)p_Var4[2]._M_nxt;
  }
  return pLVar5 == loop;
}

Assistant:

bool LICMPass::IsImmediatelyContainedInLoop(Loop* loop, Function* f,
                                            BasicBlock* bb) {
  LoopDescriptor* loop_descriptor = context()->GetLoopDescriptor(f);
  return loop == (*loop_descriptor)[bb->id()];
}